

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  Ch CVar1;
  bool bVar2;
  GenericStringStream<rapidjson::UTF8<char>_> *in_RSI;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  ParseErrorCode in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  
  GenericStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
  CVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
  if (CVar1 == 'u') {
    GenericStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
  }
  uVar3 = false;
  if (CVar1 == 'u') {
    CVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
    if (CVar1 == 'l') {
      GenericStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
    }
    uVar3 = false;
    if (CVar1 == 'l') {
      CVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
      uVar3 = CVar1 == 'l';
      if ((bool)uVar3) {
        GenericStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
      }
    }
  }
  if ((bool)uVar3 == false) {
    GenericStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)CONCAT17(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c,0x1ec50a);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)0x1ec516);
  }
  else {
    bVar2 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Null(in_RDI);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      GenericStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)CONCAT17(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c,0x1ec4ca)
      ;
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)0x1ec4d6);
    }
  }
  return;
}

Assistant:

void ParseNull(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 'n');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'u') && Consume(is, 'l') && Consume(is, 'l'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Null()))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }